

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAudio.c
# Opt level: O1

uint32_t FAudio_CreateMasteringVoice
                   (FAudio *audio,FAudioMasteringVoice **ppMasteringVoice,uint32_t InputChannels,
                   uint32_t InputSampleRate,uint32_t Flags,uint32_t DeviceIndex,
                   FAudioEffectChain *pEffectChain)

{
  uint32_t uVar1;
  uint32_t uVar2;
  FAudioMasteringVoice *pFVar3;
  FAudioMutex pvVar4;
  float *pfVar5;
  uint uVar6;
  uint32_t uVar7;
  FAudioDeviceDetails local_45c;
  
  uVar2 = FAudio_PlatformGetDeviceDetails(DeviceIndex,&local_45c);
  uVar7 = 0x88960001;
  if (uVar2 == 0) {
    pFVar3 = (FAudioMasteringVoice *)(*audio->pMalloc)(0x148);
    *ppMasteringVoice = pFVar3;
    uVar2 = 0;
    SDL_memset(pFVar3,0,0x148);
    (*ppMasteringVoice)->audio = audio;
    pFVar3 = *ppMasteringVoice;
    pFVar3->type = FAUDIO_VOICE_MASTER;
    pFVar3->flags = Flags;
    pvVar4 = FAudio_PlatformCreateMutex();
    (*ppMasteringVoice)->effectLock = pvVar4;
    pvVar4 = FAudio_PlatformCreateMutex();
    (*ppMasteringVoice)->volumeLock = pvVar4;
    pFVar3 = *ppMasteringVoice;
    pFVar3->volume = 1.0;
    uVar6 = (uint)local_45c.OutputFormat.Format.nChannels;
    if (InputChannels != 0) {
      uVar6 = InputChannels;
    }
    *(uint *)((long)&pFVar3->field_19 + 0x10) = uVar6;
    if (InputSampleRate == 0) {
      InputSampleRate = local_45c.OutputFormat.Format.nSamplesPerSec;
    }
    ((*ppMasteringVoice)->field_19).master.inputSampleRate = InputSampleRate;
    SDL_memset(&(*ppMasteringVoice)->sends,0,0xc);
    FAudioVoice_SetEffectChain(*ppMasteringVoice,pEffectChain);
    pFVar3 = *ppMasteringVoice;
    audio->master = pFVar3;
    uVar7 = pFVar3->outputChannels;
    uVar1 = (pFVar3->field_19).master.inputSampleRate;
    (audio->mixFormat).Format.wBitsPerSample = 0x20;
    (audio->mixFormat).Format.cbSize = 0x16;
    (audio->mixFormat).Format.wFormatTag = 0xfffe;
    (audio->mixFormat).Format.nChannels = (uint16_t)uVar7;
    (audio->mixFormat).Format.nSamplesPerSec = uVar1;
    (audio->mixFormat).Format.nBlockAlign = (uint16_t)(uVar7 * 4);
    (audio->mixFormat).Format.nAvgBytesPerSec = (uVar7 * 4 & 0xffff) * uVar1;
    (audio->mixFormat).Samples.wValidBitsPerSample = 0x20;
    if ((ushort)(uVar7 - 1) < 8) {
      uVar2 = *(uint32_t *)(&DAT_0012682c + (ulong)(uVar7 - 1 & 0xffff) * 4);
    }
    (audio->mixFormat).dwChannelMask = uVar2;
    SDL_memcpy(&(audio->mixFormat).SubFormat,&DATAFORMAT_SUBTYPE_IEEE_FLOAT,0x10);
    audio->refcount = audio->refcount + 1;
    FAudio_PlatformInit(audio,audio->initFlags,DeviceIndex,&audio->mixFormat,&audio->updateSize,
                        &audio->platform);
    if (audio->platform == (void *)0x0) {
      FAudioVoice_DestroyVoice(*ppMasteringVoice);
      *ppMasteringVoice = (FAudioMasteringVoice *)0x0;
      uVar7 = 0x88960004;
    }
    else {
      pFVar3 = audio->master;
      pFVar3->outputChannels = (uint)(audio->mixFormat).Format.nChannels;
      (pFVar3->field_19).master.inputSampleRate = (audio->mixFormat).Format.nSamplesPerSec;
      uVar6 = ((*ppMasteringVoice)->field_19).master.inputChannels;
      uVar7 = 0;
      if (uVar6 != (*ppMasteringVoice)->outputChannels) {
        pfVar5 = (float *)(*audio->pMalloc)((ulong)uVar6 * (ulong)audio->updateSize * 4);
        ((*ppMasteringVoice)->field_19).mix.inputCache = pfVar5;
      }
    }
  }
  return uVar7;
}

Assistant:

uint32_t FAudio_CreateMasteringVoice(
	FAudio *audio,
	FAudioMasteringVoice **ppMasteringVoice,
	uint32_t InputChannels,
	uint32_t InputSampleRate,
	uint32_t Flags,
	uint32_t DeviceIndex,
	const FAudioEffectChain *pEffectChain
) {
	FAudioDeviceDetails details;

	LOG_API_ENTER(audio)

	/* For now we only support one allocated master voice at a time */
	FAudio_assert(audio->master == NULL);

	if (FAudio_GetDeviceDetails(audio, DeviceIndex, &details) != 0)
	{
		return FAUDIO_E_INVALID_CALL;
	}

	*ppMasteringVoice = (FAudioMasteringVoice*) audio->pMalloc(sizeof(FAudioVoice));
	FAudio_zero(*ppMasteringVoice, sizeof(FAudioMasteringVoice));
	(*ppMasteringVoice)->audio = audio;
	(*ppMasteringVoice)->type = FAUDIO_VOICE_MASTER;
	(*ppMasteringVoice)->flags = Flags;
	(*ppMasteringVoice)->effectLock = FAudio_PlatformCreateMutex();
	LOG_MUTEX_CREATE(audio, (*ppMasteringVoice)->effectLock)
	(*ppMasteringVoice)->volumeLock = FAudio_PlatformCreateMutex();
	LOG_MUTEX_CREATE(audio, (*ppMasteringVoice)->volumeLock)

	/* Default Levels */
	(*ppMasteringVoice)->volume = 1.0f;

	/* Master Properties */
	(*ppMasteringVoice)->master.inputChannels = (InputChannels == FAUDIO_DEFAULT_CHANNELS) ?
		details.OutputFormat.Format.nChannels :
		InputChannels;
	(*ppMasteringVoice)->master.inputSampleRate = (InputSampleRate == FAUDIO_DEFAULT_SAMPLERATE) ?
		details.OutputFormat.Format.nSamplesPerSec :
		InputSampleRate;

	/* Sends/Effects */
	FAudio_zero(&(*ppMasteringVoice)->sends, sizeof(FAudioVoiceSends));
	FAudioVoice_SetEffectChain(*ppMasteringVoice, pEffectChain);

	/* This is now safe enough to assign */
	audio->master = *ppMasteringVoice;

	/* Build the device format.
	 * The most unintuitive part of this is the use of outputChannels
	 * instead of master.inputChannels. Bizarrely, the effect chain can
	 * dictate the _actual_ output channel count, and when the channel count
	 * mismatches, we have to add a staging buffer for effects to process on
	 * before ultimately copying the final result to the device. ARGH.
	 */
	WriteWaveFormatExtensible(
		&audio->mixFormat,
		audio->master->outputChannels,
		audio->master->master.inputSampleRate,
		&DATAFORMAT_SUBTYPE_IEEE_FLOAT
	);

	/* Platform Device */
	FAudio_AddRef(audio);
	FAudio_PlatformInit(
		audio,
		audio->initFlags,
		DeviceIndex,
		&audio->mixFormat,
		&audio->updateSize,
		&audio->platform
	);
	if (audio->platform == NULL)
	{
		FAudioVoice_DestroyVoice(*ppMasteringVoice);
		*ppMasteringVoice = NULL;

		/* Not the best code, but it's probably true? */
		return FAUDIO_E_DEVICE_INVALIDATED;
	}
	audio->master->outputChannels = audio->mixFormat.Format.nChannels;
	audio->master->master.inputSampleRate = audio->mixFormat.Format.nSamplesPerSec;

	/* Effect Chain Cache */
	if ((*ppMasteringVoice)->master.inputChannels != (*ppMasteringVoice)->outputChannels)
	{
		(*ppMasteringVoice)->master.effectCache = (float*) audio->pMalloc(
			sizeof(float) *
			audio->updateSize *
			(*ppMasteringVoice)->master.inputChannels
		);
	}

	LOG_API_EXIT(audio)
	return 0;
}